

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separator.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
flow_cutter::ComputeSeparator::operator()
          (ComputeSeparator *this,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,int max_separator_size)

{
  initializer_list<flow_cutter::SourceTargetPair> __l;
  Config config;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ConstRefIDIDFunc<ArrayIDIDFunc> CVar6;
  ConstRefIDIDFunc<ArrayIDIDFunc> CVar7;
  ConstRefIDFunc<RangeIDIDMultiFunc> CVar8;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar9;
  ArrayIDIDFunc *in_RDX;
  ConstRefIDIDFunc<ArrayIDIDFunc> in_RSI;
  ConstRefIDFunc<RangeIDIDMultiFunc> in_RDI;
  int in_R8D;
  undefined1 auVar10 [16];
  double potential_best_next_score;
  double score;
  int small_side_size;
  int cut_size;
  double best_score;
  int balance_div;
  int balance_num;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> pairs;
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  cutter;
  Config my_config;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  expanded_graph;
  ArrayIDIDFunc back_arc;
  RangeIDIDMultiFunc out_arc;
  int arc_count;
  int node_count;
  vector<int,_std::allocator<int>_> *separator;
  int in_stack_000010b4;
  int in_stack_000010b8;
  int in_stack_000010bc;
  ArrayIDIDFunc *in_stack_fffffffffffffcc8;
  vector<int,_std::allocator<int>_> *pvVar11;
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  *this_01;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *__x;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *this_02;
  undefined4 uVar12;
  undefined1 in_stack_fffffffffffffcec [12];
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
  *in_stack_fffffffffffffd18;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
  *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined8 in_stack_fffffffffffffd40;
  PierceRating PVar13;
  ConstRefIDIDFunc<ArrayIDIDFunc> back_arc_00;
  ConstRefIDIDFunc<ArrayIDIDFunc> in_stack_fffffffffffffd80;
  ArrayIDIDFunc *in_stack_fffffffffffffdc0;
  ArrayIDIDFunc *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdec;
  double local_210;
  int local_208;
  int local_204;
  EVP_PKEY_CTX local_1e8 [24];
  SourceTargetPair local_1d0;
  SourceTargetPair *in_stack_fffffffffffffe38;
  ArrayIDIDFunc *in_stack_fffffffffffffe40;
  ArrayIDIDFunc *in_stack_fffffffffffffe48;
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  local_158;
  vector<int,_std::allocator<int>_> *local_f8;
  undefined8 uStack_f0;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *pvStack_e8;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *pvStack_e0;
  undefined4 local_d8;
  RangeIDIDMultiFunc *local_d0;
  ArrayIDIDFunc *local_c8;
  ArrayIDIDFunc *local_c0;
  ArrayIDIDFunc *local_b8;
  int local_2c;
  int local_28;
  int local_24;
  ArrayIDIDFunc *local_18;
  
  back_arc_00.ptr = (ArrayIDIDFunc *)in_RDI.ptr;
  local_24 = in_R8D;
  local_18 = in_RDX;
  local_28 = ArrayIDIDFunc::image_count(in_RDX);
  local_2c = ArrayIDFunc<int>::preimage_count(&local_18->super_ArrayIDFunc<int>);
  invert_sorted_id_id_func<ArrayIDIDFunc>
            ((ArrayIDIDFunc *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  compute_back_arc_permutation<ArrayIDIDFunc,ArrayIDIDFunc>
            ((ArrayIDIDFunc *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (ArrayIDIDFunc *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  local_b8 = (ArrayIDIDFunc *)make_const_ref_id_id_func<ArrayIDIDFunc>(in_stack_fffffffffffffcc8);
  PVar13 = (PierceRating)local_b8;
  CVar6 = make_const_ref_id_id_func<ArrayIDIDFunc>(in_stack_fffffffffffffcc8);
  local_c0 = CVar6.ptr;
  CVar7 = make_const_ref_id_id_func<ArrayIDIDFunc>(in_stack_fffffffffffffcc8);
  local_c8 = CVar7.ptr;
  CVar8 = make_const_ref_id_func<RangeIDIDMultiFunc>
                    ((RangeIDIDMultiFunc *)in_stack_fffffffffffffcc8);
  local_d0 = (RangeIDIDMultiFunc *)CVar8;
  flow_cutter::expanded_graph::
  make_graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDFunc<RangeIDIDMultiFunc>>
            (in_stack_fffffffffffffd80,in_RSI,back_arc_00,in_RDI);
  uVar12 = *(undefined4 *)&in_RSI.ptr[1].super_ArrayIDFunc<int>.data_;
  pvVar11 = *(vector<int,_std::allocator<int>_> **)&(in_RSI.ptr)->super_ArrayIDFunc<int>;
  __x = *(vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> **)
         &(in_RSI.ptr)->image_count_;
  this_02 = *(vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              **)&in_RSI.ptr[1].super_ArrayIDFunc<int>;
  uStack_f0 = (SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
               *)CONCAT44((int)((ulong)((in_RSI.ptr)->super_ArrayIDFunc<int>).data_ >> 0x20),
                          local_24);
  config._8_8_ = CVar8.ptr;
  config.cutter_count = (int)in_stack_fffffffffffffd40;
  config.random_seed = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  config._16_8_ = CVar7.ptr;
  config._24_8_ = CVar6.ptr;
  config.pierce_rating = PVar13;
  this_01 = uStack_f0;
  local_f8 = pvVar11;
  pvStack_e8 = __x;
  pvStack_e0 = this_02;
  local_d8 = uVar12;
  make_simple_cutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
            ((Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
              *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),config);
  std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::vector
            ((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              *)0x17a6a7);
  if (((in_RSI.ptr)->super_ArrayIDFunc<int>).preimage_count_ < 1) {
    local_1d0 = compute_distant_node_pair<ArrayIDIDFunc,ArrayIDIDFunc>
                          (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffe38 = &local_1d0;
    in_stack_fffffffffffffe40 = (ArrayIDIDFunc *)0x1;
    __l._4_12_ = in_stack_fffffffffffffcec;
    __l._M_array._0_4_ = uVar12;
    std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
    operator=(this_02,__l);
  }
  else {
    select_random_source_target_pairs(in_stack_000010bc,in_stack_000010b8,in_stack_000010b4);
    std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
    operator=(this_02,__x);
    std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
    ~vector(this_02);
  }
  std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::vector
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  flow_cutter::expanded_graph::expand_source_target_pair_list
            ((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  ::init(&local_158,local_1e8);
  std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
  ~vector(this_02);
  std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
  ~vector(this_02);
  uVar2 = (uint)(*(int *)&((in_RSI.ptr)->super_ArrayIDFunc<int>).field_0x4 * local_28) % 3;
  if (((uVar2 == 0) || (uVar2 == 1)) || (uVar2 == 2)) {
    local_204 = 1;
    local_208 = 4;
  }
  local_210 = std::numeric_limits<double>::max();
  in_stack_fffffffffffffdec = in_stack_fffffffffffffdec & 0xffffff;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17a919);
  do {
    this_00 = SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
              ::get_current_cut((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                                 *)0x17a926);
    sVar9 = std::vector<int,_std::allocator<int>_>::size(this_00);
    iVar3 = (int)sVar9;
    iVar4 = SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
            ::get_current_smaller_cut_side_size
                      ((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                        *)0x17a94b);
    if (local_24 < iVar3) break;
    if (local_204 * (local_28 - iVar3) < local_208 * iVar4) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_210;
      if ((double)iVar3 / (double)iVar4 < local_210) {
        flow_cutter::expanded_graph::
        extract_original_separator<ArrayIDIDFunc,ArrayIDIDFunc,flow_cutter::SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>>
                  ((ArrayIDIDFunc *)CONCAT44(in_stack_fffffffffffffdec,iVar3),
                   (ArrayIDIDFunc *)CONCAT44(iVar4,in_stack_fffffffffffffde0),
                   (SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                    *)((double)iVar3 / (double)iVar4));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)this_01,pvVar11);
        remove_nodes_from_separator_as_long_as_result_is_balanced<ArrayIDIDFunc,ArrayIDIDFunc>
                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe38);
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)this_02,
                   (vector<int,_std::allocator<int>_> *)__x);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)this_02);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)this_02);
        flow_cutter::expanded_graph::Separator::~Separator((Separator *)0x17aa99);
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)in_RDI.ptr);
        auVar10 = vcvtusi2sd_avx512f(auVar10,sVar9);
        local_210 = auVar10._0_8_ / (double)iVar4;
      }
      iVar4 = iVar3 + 1;
      iVar5 = flow_cutter::expanded_graph::expanded_node_count(local_28);
      if (local_210 <= (double)iVar4 / (double)(iVar5 / 2)) break;
    }
    bVar1 = SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
            ::advance((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdec,iVar3));
  } while (bVar1);
  std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
  ~vector(this_02);
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  ::~SimpleCutter(this_01);
  ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x17abd3);
  RangeIDIDMultiFunc::~RangeIDIDMultiFunc((RangeIDIDMultiFunc *)0x17abe0);
  return (vector<int,_std::allocator<int>_> *)back_arc_00.ptr;
}

Assistant:

std::vector<int> operator()(const Tail& tail, const Head& head, int max_separator_size) const
    {

        const int node_count = tail.image_count();
        const int arc_count = tail.preimage_count();
        (void)arc_count;

        auto out_arc = invert_sorted_id_id_func(tail);
        auto back_arc = compute_back_arc_permutation(tail, head);

        auto expanded_graph = expanded_graph::make_graph(
            make_const_ref_id_id_func(tail), make_const_ref_id_id_func(head),
            make_const_ref_id_id_func(back_arc), make_const_ref_id_func(out_arc));

        Config my_config = config;
        my_config.max_cut_size = max_separator_size;

        auto cutter = make_simple_cutter(expanded_graph, my_config);
        std::vector<SourceTargetPair> pairs;
        if (config.cutter_count > 0)
            pairs = select_random_source_target_pairs(node_count, config.cutter_count, config.random_seed);
        else
            pairs = { compute_distant_node_pair(tail, head) };

        cutter.init(expanded_graph::expand_source_target_pair_list(pairs),
            config.random_seed);

        int balance_num, balance_div;
        switch (((unsigned)config.random_seed * (unsigned)node_count) % 3) {
        case 0:
            balance_num = 1;
            balance_div = 3;
        case 1:
            balance_num = 2;
            balance_div = 5;
        case 2:
            balance_num = 1;
            balance_div = 4;
        }

        double best_score = std::numeric_limits<double>::max();
        std::vector<int> separator;

        for (;;) {
            int cut_size = cutter.get_current_cut().size();
            int small_side_size = cutter.get_current_smaller_cut_side_size();

            if (cut_size > max_separator_size)
                break;

            

            if (balance_div * small_side_size > balance_num * (node_count - cut_size)) {

                double score = (double)cut_size / (double)small_side_size;
                if (score < best_score) {
                    separator = remove_nodes_from_separator_as_long_as_result_is_balanced(tail, head, expanded_graph::extract_original_separator(tail, head, cutter).sep);
                    score = (double)separator.size() / (double)small_side_size;
                    best_score = score;
                }

                double potential_best_next_score = (double)(cut_size + 1) / (double)(expanded_graph::expanded_node_count(node_count) / 2);
                if (potential_best_next_score >= best_score)
                    break;
            }

            if (!cutter.advance())
                break;
        }

        return separator;
    }